

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

TPZFMatrix<double> * __thiscall
TPZMatrix<double>::Storage(TPZFMatrix<double> *__return_storage_ptr__,TPZMatrix<double> *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(this);
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4d])(this);
  TPZFMatrix<double>::TPZFMatrix
            (__return_storage_ptr__,CONCAT44(extraout_var,iVar1),1,
             (double *)CONCAT44(extraout_var_00,iVar2),CONCAT44(extraout_var,iVar1));
  return __return_storage_ptr__;
}

Assistant:

const TPZFMatrix<TVar> TPZMatrix<TVar>::Storage() const
{
  const auto size = Size();
  const auto elem = Elem();
	TPZFMatrix<TVar> ref(size,1,const_cast<TVar*>(elem),size);
	return ref;
}